

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs8_x509.cc
# Opt level: O1

int PKCS12_handle_content_info(CBS *content_info,pkcs12_context *ctx)

{
  int iVar1;
  int line;
  uint8_t *out;
  uint8_t *storage;
  CBS contents;
  size_t out_len;
  CBS eci;
  CBS encrypted_contents;
  CBS wrapped_contents;
  CBS content_type;
  CBS ai;
  CBS contents_type;
  CBS safe_contents;
  CBS version_bytes;
  uint8_t *local_b8;
  uint8_t *local_b0;
  CBS local_a8;
  size_t local_98;
  CBS local_90;
  CBS local_80;
  CBS local_70;
  CBS local_60;
  CBS local_50;
  CBS local_40;
  CBS local_30;
  CBS local_20;
  
  local_b0 = (uint8_t *)0x0;
  iVar1 = CBS_get_asn1(content_info,&local_60,6);
  if (iVar1 == 0) {
LAB_00197e89:
    line = 0x1bc;
  }
  else {
    iVar1 = CBS_get_asn1(content_info,&local_70,0xa0000000);
    if ((iVar1 == 0) || (content_info->len != 0)) goto LAB_00197e89;
    iVar1 = CBS_mem_equal(&local_60,kPKCS7EncryptedData,9);
    if (iVar1 == 0) {
      iVar1 = CBS_mem_equal(&local_60,kPKCS7Data,9);
      if (iVar1 == 0) {
        iVar1 = 1;
        goto LAB_00197ea9;
      }
      iVar1 = CBS_get_asn1(&local_70,&local_a8,4);
      if (iVar1 != 0) {
        iVar1 = PKCS12_handle_sequence(&local_a8,ctx,PKCS12_handle_safe_bag);
        goto LAB_00197ea9;
      }
      line = 0x1ef;
    }
    else {
      iVar1 = CBS_get_asn1(&local_70,&local_a8,0x20000010);
      if (iVar1 != 0) {
        iVar1 = CBS_get_asn1(&local_a8,&local_20,2);
        if (iVar1 != 0) {
          iVar1 = CBS_get_asn1(&local_a8,&local_90,0x20000010);
          if (iVar1 != 0) {
            iVar1 = CBS_get_asn1(&local_90,&local_40,6);
            if (iVar1 != 0) {
              iVar1 = CBS_get_asn1(&local_90,&local_50,0x20000010);
              if (iVar1 != 0) {
                iVar1 = CBS_get_asn1_implicit_string(&local_90,&local_80,&local_b0,0x80000000,4);
                if (iVar1 != 0) {
                  iVar1 = CBS_mem_equal(&local_40,kPKCS7Data,9);
                  if (iVar1 != 0) {
                    iVar1 = pkcs8_pbe_decrypt(&local_b8,&local_98,&local_50,ctx->password,
                                              ctx->password_len,local_80.data,local_80.len);
                    if (iVar1 == 0) {
                      iVar1 = 0;
                    }
                    else {
                      local_30.data = local_b8;
                      local_30.len = local_98;
                      iVar1 = PKCS12_handle_sequence(&local_30,ctx,PKCS12_handle_safe_bag);
                      OPENSSL_free(local_b8);
                    }
                    goto LAB_00197ea9;
                  }
                  line = 0x1dc;
                  goto LAB_00197ea4;
                }
              }
            }
          }
        }
      }
      line = 0x1d7;
    }
  }
LAB_00197ea4:
  iVar1 = 0;
  ERR_put_error(0x13,0,100,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs8_x509.cc"
                ,line);
LAB_00197ea9:
  OPENSSL_free(local_b0);
  return iVar1;
}

Assistant:

static int PKCS12_handle_content_info(CBS *content_info,
                                      struct pkcs12_context *ctx) {
  CBS content_type, wrapped_contents, contents;
  int ret = 0;
  uint8_t *storage = NULL;

  if (!CBS_get_asn1(content_info, &content_type, CBS_ASN1_OBJECT) ||
      !CBS_get_asn1(content_info, &wrapped_contents,
                    CBS_ASN1_CONTEXT_SPECIFIC | CBS_ASN1_CONSTRUCTED | 0) ||
      CBS_len(content_info) != 0) {
    OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_BAD_PKCS12_DATA);
    goto err;
  }

  if (CBS_mem_equal(&content_type, kPKCS7EncryptedData,
                    sizeof(kPKCS7EncryptedData))) {
    // See https://tools.ietf.org/html/rfc2315#section-13.
    //
    // PKCS#7 encrypted data inside a PKCS#12 structure is generally an
    // encrypted certificate bag and it's generally encrypted with 40-bit
    // RC2-CBC.
    CBS version_bytes, eci, contents_type, ai, encrypted_contents;
    uint8_t *out;
    size_t out_len;

    if (!CBS_get_asn1(&wrapped_contents, &contents, CBS_ASN1_SEQUENCE) ||
        !CBS_get_asn1(&contents, &version_bytes, CBS_ASN1_INTEGER) ||
        // EncryptedContentInfo, see
        // https://tools.ietf.org/html/rfc2315#section-10.1
        !CBS_get_asn1(&contents, &eci, CBS_ASN1_SEQUENCE) ||
        !CBS_get_asn1(&eci, &contents_type, CBS_ASN1_OBJECT) ||
        // AlgorithmIdentifier, see
        // https://tools.ietf.org/html/rfc5280#section-4.1.1.2
        !CBS_get_asn1(&eci, &ai, CBS_ASN1_SEQUENCE) ||
        !CBS_get_asn1_implicit_string(&eci, &encrypted_contents, &storage,
                                      CBS_ASN1_CONTEXT_SPECIFIC | 0,
                                      CBS_ASN1_OCTETSTRING)) {
      OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_BAD_PKCS12_DATA);
      goto err;
    }

    if (!CBS_mem_equal(&contents_type, kPKCS7Data, sizeof(kPKCS7Data))) {
      OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_BAD_PKCS12_DATA);
      goto err;
    }

    if (!pkcs8_pbe_decrypt(&out, &out_len, &ai, ctx->password,
                           ctx->password_len, CBS_data(&encrypted_contents),
                           CBS_len(&encrypted_contents))) {
      goto err;
    }

    CBS safe_contents;
    CBS_init(&safe_contents, out, out_len);
    ret = PKCS12_handle_sequence(&safe_contents, ctx, PKCS12_handle_safe_bag);
    OPENSSL_free(out);
  } else if (CBS_mem_equal(&content_type, kPKCS7Data, sizeof(kPKCS7Data))) {
    CBS octet_string_contents;

    if (!CBS_get_asn1(&wrapped_contents, &octet_string_contents,
                      CBS_ASN1_OCTETSTRING)) {
      OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_BAD_PKCS12_DATA);
      goto err;
    }

    ret = PKCS12_handle_sequence(&octet_string_contents, ctx,
                                 PKCS12_handle_safe_bag);
  } else {
    // Unknown element type - ignore it.
    ret = 1;
  }

err:
  OPENSSL_free(storage);
  return ret;
}